

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClau.c
# Opt level: O3

void Fra_ClauReduceClause(Vec_Int_t *vMain,Vec_Int_t *vNew)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  
  uVar3 = vMain->nSize;
  if (vNew->nSize < (int)uVar3) {
    __assert_fail("Vec_IntSize(vMain) <= Vec_IntSize(vNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraClau.c"
                  ,0x1dc,"void Fra_ClauReduceClause(Vec_Int_t *, Vec_Int_t *)");
  }
  if ((int)uVar3 < 1) {
    uVar2 = 0;
    if (uVar3 != 0) goto LAB_005cbaf1;
  }
  else {
    lVar7 = 0;
    uVar2 = 0;
    uVar5 = 0;
    do {
      if (vNew->nSize <= lVar7) break;
      iVar1 = vMain->pArray[uVar5];
      iVar6 = vNew->pArray[lVar7] >> 1;
      if (iVar1 >> 1 < iVar6) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraClau.c"
                      ,0x1e5,"void Fra_ClauReduceClause(Vec_Int_t *, Vec_Int_t *)");
      }
      if (iVar1 >> 1 <= iVar6) {
        uVar5 = uVar5 + 1;
        if (iVar1 == vNew->pArray[lVar7]) {
          if (((int)uVar2 < 0) || (uVar3 <= uVar2)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                          ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          uVar4 = (ulong)uVar2;
          uVar2 = uVar2 + 1;
          vMain->pArray[uVar4] = iVar1;
          uVar3 = vMain->nSize;
        }
      }
      lVar7 = lVar7 + 1;
    } while ((int)uVar5 < (int)uVar3);
    if (uVar5 != uVar3) {
LAB_005cbaf1:
      __assert_fail("i == Vec_IntSize(vMain)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraClau.c"
                    ,499,"void Fra_ClauReduceClause(Vec_Int_t *, Vec_Int_t *)");
    }
    if ((int)uVar5 < (int)uVar2) {
      __assert_fail("p->nSize >= nSizeNew",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x2ac,"void Vec_IntShrink(Vec_Int_t *, int)");
    }
  }
  vMain->nSize = uVar2;
  return;
}

Assistant:

void Fra_ClauReduceClause( Vec_Int_t * vMain, Vec_Int_t * vNew )
{
    int LitM, LitN, VarM, VarN, i, j, k;
    assert( Vec_IntSize(vMain) <= Vec_IntSize(vNew) );
    for ( i = j = k = 0; i < Vec_IntSize(vMain) && j < Vec_IntSize(vNew); )
    {
        LitM = Vec_IntEntry( vMain, i );
        LitN = Vec_IntEntry( vNew, j );
        VarM = lit_var( LitM );
        VarN = lit_var( LitN );
        if ( VarM < VarN )
        {
            assert( 0 );
        }
        else if ( VarM > VarN )
        {
            j++;
        }
        else // if ( VarM == VarN )
        {
            i++;
            j++;
            if ( LitM == LitN )
                Vec_IntWriteEntry( vMain, k++, LitM );
        }
    }
    assert( i == Vec_IntSize(vMain) );
    Vec_IntShrink( vMain, k );
}